

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Connection::Table(Connection *this,string *schema_name,string *table_name)

{
  size_type sVar1;
  CatalogException *this_00;
  string *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::Relation,_true> sVar2;
  allocator local_92;
  allocator local_91;
  unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
  table_info;
  string local_88;
  string local_68;
  string local_48;
  
  ::std::__cxx11::string::string
            ((string *)&local_88,anon_var_dwarf_4b71df5 + 9,(allocator *)&local_68);
  TableInfo((Connection *)&table_info,schema_name,&local_88,table_name);
  ::std::__cxx11::string::~string((string *)&local_88);
  if (table_info.
      super_unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::TableDescription_*,_std::default_delete<duckdb::TableDescription>_>
      .super__Head_base<0UL,_duckdb::TableDescription_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true,_true>
       )0x0) {
    make_shared_ptr<duckdb::TableRelation,duckdb::shared_ptr<duckdb::ClientContext,true>&,duckdb::unique_ptr<duckdb::TableDescription,std::default_delete<duckdb::TableDescription>,true>>
              ((shared_ptr<duckdb::ClientContext,_true> *)&local_88,
               (unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
                *)schema_name);
    sVar1 = local_88._M_string_length;
    local_88._M_string_length = 0;
    (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_88._M_dataplus._M_p;
    (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar1;
    local_88._M_dataplus._M_p = (pointer)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
    ::std::unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>::
    ~unique_ptr(&table_info.
                 super_unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>
               );
    sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<duckdb::Relation,_true>)
           sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (CatalogException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_88,"Table %s does not exist!",&local_91);
  ::std::__cxx11::string::string((string *)&local_68,anon_var_dwarf_4b71df5 + 9,&local_92);
  ParseInfo::QualifierToString(&local_48,&local_68,table_name,in_RCX);
  CatalogException::CatalogException<std::__cxx11::string>(this_00,&local_88,&local_48);
  __cxa_throw(this_00,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

shared_ptr<Relation> Connection::Table(const string &schema_name, const string &table_name) {
	auto table_info = TableInfo(INVALID_CATALOG, schema_name, table_name);
	if (!table_info) {
		throw CatalogException("Table %s does not exist!", ParseInfo::QualifierToString("", schema_name, table_name));
	}
	return make_shared_ptr<TableRelation>(context, std::move(table_info));
}